

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O2

void __thiscall glTF2::Material::Material(Material *this)

{
  (this->super_Object).id._M_dataplus._M_p = (pointer)&(this->super_Object).id.field_2;
  (this->super_Object).id._M_string_length = 0;
  (this->super_Object).id.field_2._M_local_buf[0] = '\0';
  (this->super_Object).name._M_dataplus._M_p = (pointer)&(this->super_Object).name.field_2;
  (this->super_Object).name._M_string_length = 0;
  (this->super_Object).name.field_2._M_local_buf[0] = '\0';
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_007fdb00;
  (this->pbrMetallicRoughness).baseColorTexture.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->pbrMetallicRoughness).baseColorTexture.texture.index = 0;
  (this->pbrMetallicRoughness).metallicRoughnessTexture.texCoord = 0;
  *(undefined8 *)&(this->pbrMetallicRoughness).baseColorTexture.texCoord = 0;
  *(undefined8 *)((long)&(this->pbrMetallicRoughness).metallicRoughnessTexture.texture.vector + 4) =
       0;
  (this->normalTexture).super_TextureInfo.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->normalTexture).super_TextureInfo.texture.index = 0;
  *(undefined8 *)&(this->normalTexture).super_TextureInfo.texCoord = 0x3f80000000000000;
  (this->occlusionTexture).super_TextureInfo.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->occlusionTexture).super_TextureInfo.texture.index = 0;
  *(undefined8 *)&(this->occlusionTexture).super_TextureInfo.texCoord = 0x3f80000000000000;
  (this->emissiveTexture).texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->emissiveTexture).texture.index = 0;
  (this->emissiveTexture).texCoord = 0;
  (this->alphaMode)._M_dataplus._M_p = (pointer)&(this->alphaMode).field_2;
  (this->alphaMode)._M_string_length = 0;
  (this->alphaMode).field_2._M_local_buf[0] = '\0';
  Nullable<glTF2::PbrSpecularGlossiness>::Nullable(&this->pbrSpecularGlossiness);
  SetDefaults(this);
  return;
}

Assistant:

Material() { SetDefaults(); }